

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

Torsion * __thiscall
OpenMD::MoleculeCreator::createTorsion
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,TorsionStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  bool bVar1;
  int index;
  size_type sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Torsion *pTVar6;
  Atom *pAVar7;
  TorsionStamp *in_RCX;
  undefined8 in_RDX;
  string s;
  OpenMDException *e_1;
  DirectionalAtom *dAtom;
  OpenMDException *e;
  Atom *atomD;
  Atom *atomC;
  Atom *atomB;
  Atom *atomA;
  vector<int,_std::allocator<int>_> torsionAtoms;
  Torsion *torsion;
  TorsionType *torsionType;
  TorsionTypeParser ttParser;
  char *in_stack_fffffffffffffaa8;
  Molecule *in_stack_fffffffffffffab0;
  DirectionalAtom *in_stack_fffffffffffffab8;
  Atom *in_stack_fffffffffffffac0;
  Atom *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  allocator<char> *in_stack_fffffffffffffae0;
  string *this_00;
  TorsionType *in_stack_fffffffffffffae8;
  errorStruct *peVar8;
  Atom *in_stack_fffffffffffffaf0;
  Atom *in_stack_fffffffffffffaf8;
  Atom *in_stack_fffffffffffffb00;
  Atom *in_stack_fffffffffffffb08;
  Torsion *in_stack_fffffffffffffb10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb28;
  TorsionTypeParser *in_stack_fffffffffffffb30;
  long local_4b8;
  undefined8 in_stack_fffffffffffffb58;
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [16];
  TorsionTypeParser *in_stack_fffffffffffffcc0;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [96];
  string local_248 [32];
  long local_228;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [56];
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  ForceField *in_stack_ffffffffffffff18;
  string local_e0 [32];
  Atom *local_c0;
  Atom *local_b8;
  Atom *local_b0;
  Atom *local_a8;
  undefined4 local_a0;
  vector<int,_std::allocator<int>_> local_90;
  Torsion *local_78;
  TorsionType *local_70;
  TorsionStamp *local_28;
  undefined8 local_20;
  Torsion *local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  TorsionTypeParser::TorsionTypeParser(in_stack_fffffffffffffcc0);
  local_70 = (TorsionType *)0x0;
  local_78 = (Torsion *)0x0;
  TorsionStamp::getMembers((TorsionStamp *)in_stack_fffffffffffffaa8);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_90);
  if (sVar2 < 3) {
    local_8 = local_78;
    local_a0 = 1;
  }
  else {
    std::vector<int,_std::allocator<int>_>::operator[](&local_90,0);
    local_a8 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                   (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[](&local_90,1);
    local_b0 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                   (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[](&local_90,2);
    local_b8 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                   (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_90);
    if (sVar2 == 4) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_90,3);
      local_c0 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                     (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
      bVar1 = TorsionStamp::hasOverride(local_28);
      if (bVar1) {
        TorsionStamp::getOverrideType_abi_cxx11_((TorsionStamp *)in_stack_fffffffffffffaa8);
        TorsionStamp::getOverridePars((TorsionStamp *)in_stack_fffffffffffffaa8);
        local_70 = TorsionTypeParser::parseTypeAndPars
                             (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                              in_stack_fffffffffffffb20);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
        std::__cxx11::string::~string(local_e0);
      }
      else {
        (*(local_a8->super_StuntDouble)._vptr_StuntDouble[7])(local_140);
        (*(local_b0->super_StuntDouble)._vptr_StuntDouble[7])(local_160);
        (*(local_b8->super_StuntDouble)._vptr_StuntDouble[7])(local_180);
        (*(local_c0->super_StuntDouble)._vptr_StuntDouble[7])(local_1a0);
        local_70 = ForceField::getTorsionType
                             (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string(local_180);
        std::__cxx11::string::~string(local_160);
        std::__cxx11::string::~string(local_140);
        if (local_70 == (TorsionType *)0x0) {
          (*(local_a8->super_StuntDouble)._vptr_StuntDouble[7])(local_1c0);
          uVar3 = std::__cxx11::string::c_str();
          (*(local_b0->super_StuntDouble)._vptr_StuntDouble[7])(local_1e0);
          uVar4 = std::__cxx11::string::c_str();
          (*(local_b8->super_StuntDouble)._vptr_StuntDouble[7])(local_200);
          uVar5 = std::__cxx11::string::c_str();
          (*(local_c0->super_StuntDouble)._vptr_StuntDouble[7])(local_220);
          in_stack_fffffffffffffaa8 = (char *)std::__cxx11::string::c_str();
          snprintf(painCave.errMsg,2000,"Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   uVar3,uVar4,uVar5);
          std::__cxx11::string::~string(local_220);
          std::__cxx11::string::~string(local_200);
          std::__cxx11::string::~string(local_1e0);
          std::__cxx11::string::~string(local_1c0);
          painCave.isFatal = 1;
          simError();
        }
      }
      pTVar6 = (Torsion *)operator_new(0x98);
      Torsion::Torsion(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00
                       ,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                       in_stack_fffffffffffffae8);
      local_78 = pTVar6;
    }
    else {
      TorsionStamp::getGhostVectorSource((TorsionStamp *)0x224375);
      pAVar7 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                   (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
      if (pAVar7 == (Atom *)0x0) {
        local_4b8 = 0;
        in_stack_fffffffffffffb58 = local_20;
      }
      else {
        local_4b8 = __dynamic_cast(pAVar7,&Atom::typeinfo,&DirectionalAtom::typeinfo,0);
        in_stack_fffffffffffffb58 = local_20;
      }
      local_228 = local_4b8;
      if (local_4b8 == 0) {
        snprintf(painCave.errMsg,2000,"Can not cast Atom to DirectionalAtom");
        painCave.isFatal = 1;
        simError();
      }
      bVar1 = TorsionStamp::hasOverride(local_28);
      if (bVar1) {
        TorsionStamp::getOverrideType_abi_cxx11_((TorsionStamp *)in_stack_fffffffffffffaa8);
        TorsionStamp::getOverridePars((TorsionStamp *)in_stack_fffffffffffffaa8);
        local_70 = TorsionTypeParser::parseTypeAndPars
                             (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                              in_stack_fffffffffffffb20);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
        std::__cxx11::string::~string(local_248);
      }
      else {
        (*(local_a8->super_StuntDouble)._vptr_StuntDouble[7])(local_2a8);
        (*(local_b0->super_StuntDouble)._vptr_StuntDouble[7])(local_2c8);
        (*(local_b8->super_StuntDouble)._vptr_StuntDouble[7])(local_2e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                   in_stack_fffffffffffffae0);
        local_70 = ForceField::getTorsionType
                             (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8);
        std::__cxx11::string::~string(local_308);
        std::allocator<char>::~allocator(&local_309);
        std::__cxx11::string::~string(local_2e8);
        std::__cxx11::string::~string(local_2c8);
        std::__cxx11::string::~string(local_2a8);
        if (local_70 == (TorsionType *)0x0) {
          (*(local_a8->super_StuntDouble)._vptr_StuntDouble[7])(local_330);
          uVar3 = std::__cxx11::string::c_str();
          (*(local_b0->super_StuntDouble)._vptr_StuntDouble[7])(local_350);
          uVar4 = std::__cxx11::string::c_str();
          (*(local_b8->super_StuntDouble)._vptr_StuntDouble[7])(local_370);
          this_00 = local_370;
          uVar5 = std::__cxx11::string::c_str();
          in_stack_fffffffffffffaa8 = "GHOST";
          peVar8 = &painCave;
          snprintf(painCave.errMsg,2000,"Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   uVar3,uVar4,uVar5);
          std::__cxx11::string::~string(this_00);
          std::__cxx11::string::~string(local_350);
          std::__cxx11::string::~string(local_330);
          peVar8->isFatal = 1;
          simError();
        }
      }
      pTVar6 = (Torsion *)operator_new(0x98);
      GhostTorsion::GhostTorsion
                ((GhostTorsion *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                 (TorsionType *)in_stack_fffffffffffffab0);
      local_78 = pTVar6;
    }
    pTVar6 = local_78;
    index = LocalIndexManager::getNextTorsionIndex((LocalIndexManager *)0x2249ab);
    ShortRangeInteraction::setLocalIndex(&pTVar6->super_ShortRangeInteraction,index);
    in_stack_fffffffffffffac0 = (Atom *)Molecule::getNTorsions((Molecule *)0x2249ce);
    OpenMD_itoa_abi_cxx11_
              ((int)((ulong)in_stack_fffffffffffffb58 >> 0x20),(uint)in_stack_fffffffffffffb58);
    pTVar6 = local_78;
    Molecule::getType_abi_cxx11_((Molecule *)in_stack_fffffffffffffaa8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar6,
                   (char *)in_stack_fffffffffffffab0);
    std::__cxx11::string::c_str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar6,
                   (char *)in_stack_fffffffffffffab0);
    (*(pTVar6->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(pTVar6,local_3b0);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_3f0);
    local_8 = local_78;
    local_a0 = 1;
    std::__cxx11::string::~string(local_390);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0);
  TorsionTypeParser::~TorsionTypeParser((TorsionTypeParser *)0x224b6b);
  return local_8;
}

Assistant:

Torsion* MoleculeCreator::createTorsion(ForceField* ff, Molecule* mol,
                                          TorsionStamp* stamp,
                                          LocalIndexManager* localIndexMan) {
    TorsionTypeParser ttParser;
    TorsionType* torsionType = NULL;
    Torsion* torsion         = NULL;

    std::vector<int> torsionAtoms = stamp->getMembers();
    if (torsionAtoms.size() < 3) { return torsion; }

    Atom* atomA = mol->getAtomAt(torsionAtoms[0]);
    Atom* atomB = mol->getAtomAt(torsionAtoms[1]);
    Atom* atomC = mol->getAtomAt(torsionAtoms[2]);

    if (torsionAtoms.size() == 4) {
      Atom* atomD = mol->getAtomAt(torsionAtoms[3]);

      assert(atomA && atomB && atomC && atomD);

      if (stamp->hasOverride()) {
        try {
          torsionType = ttParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        torsionType = ff->getTorsionType(atomA->getType(), atomB->getType(),
                                         atomC->getType(), atomD->getType());
        if (torsionType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str(), atomD->getType().c_str());

          painCave.isFatal = 1;
          simError();
        }
      }

      torsion = new Torsion(atomA, atomB, atomC, atomD, torsionType);
    } else {
      DirectionalAtom* dAtom = dynamic_cast<DirectionalAtom*>(
          mol->getAtomAt(stamp->getGhostVectorSource()));
      if (dAtom == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not cast Atom to DirectionalAtom");
        painCave.isFatal = 1;
        simError();
      }

      if (stamp->hasOverride()) {
        try {
          torsionType = ttParser.parseTypeAndPars(stamp->getOverrideType(),
                                                  stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        torsionType = ff->getTorsionType(atomA->getType(), atomB->getType(),
                                         atomC->getType(), "GHOST");

        if (torsionType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Torsion Type for[%s, %s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str(), "GHOST");

          painCave.isFatal = 1;
          simError();
        }
      }

      torsion = new GhostTorsion(atomA, atomB, dAtom, torsionType);
    }

    // set the local index of this torsion, the global index will be set later
    torsion->setLocalIndex(localIndexMan->getNextTorsionIndex());

    // The rule for naming a torsion is: MoleculeName_Torsion_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Torsion"
    // The third part is the index of the torsion defined in meta-data file
    // For example, Butane_Torsion_0 is a valid Torsion name in a
    // butane molecule

    std::string s = OpenMD_itoa(mol->getNTorsions(), 10);
    torsion->setName(mol->getType() + "_Torsion_" + s.c_str());
    return torsion;
  }